

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20240722::container_internal::
     map_slot_policy<std::__cxx11::string,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>
     ::
     construct<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
                *alloc,slot_type *slot,piecewise_construct_t *args,
               tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
               *args_1,tuple<> *args_2)

{
  tuple<> *args_local_2;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
  *args_local_1;
  piecewise_construct_t *args_local;
  slot_type *slot_local;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>_>
  *alloc_local;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>
  ::emplace(slot);
  std::
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>>>
  ::
  construct<std::pair<std::__cxx11::string,google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<>>
            (alloc,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::cpp::FileGenerator::ForwardDeclarations>
                    *)&slot->value,args,args_1,args_2);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, Args&&... args) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->mutable_value,
                                                   std::forward<Args>(args)...);
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::forward<Args>(args)...);
    }
  }